

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_art.cpp
# Opt level: O0

void __thiscall
anon_unknown.dwarf_1ac67::
ARTCorrectnessTest_TwoInstances_Test<unodb::db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>
::ARTCorrectnessTest_TwoInstances_Test
          (ARTCorrectnessTest_TwoInstances_Test<unodb::db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>
           *this)

{
  ARTCorrectnessTest_TwoInstances_Test<unodb::db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>
  *this_local;
  
  ARTCorrectnessTest<unodb::db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>
  ::ARTCorrectnessTest
            (&this->
              super_ARTCorrectnessTest<unodb::db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>
            );
  (this->
  super_ARTCorrectnessTest<unodb::db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>
  ).super_Test._vptr_Test = (_func_int **)&PTR__ARTCorrectnessTest_TwoInstances_Test_0042a238;
  return;
}

Assistant:

UNODB_TYPED_TEST(ARTCorrectnessTest, TwoInstances) {
  unodb::test::tree_verifier<TypeParam> v1;
  unodb::test::tree_verifier<TypeParam> v2;

  unodb::test::thread<TypeParam> second_thread([&v2] {
    thread_syncs[0].notify();
    thread_syncs[1].wait();

    v2.insert(0, unodb::test::test_values[0]);
    v2.check_present_values();
  });

  thread_syncs[0].wait();
  thread_syncs[1].notify();

  v1.insert(0, unodb::test::test_values[1]);
  v1.check_present_values();

  second_thread.join();
}